

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boyer_moore.hpp
# Opt level: O1

__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
boost::xpressive::detail::
boyer_moore<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
::find_nocase_(boyer_moore<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
               *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     begin,
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              end,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char *pcVar1;
  ctype<char> *pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  char cVar4;
  byte bVar5;
  difference_type __d;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  
  uVar7 = (ulong)this->length_;
  _Var3._M_current = begin._M_current;
  uVar6 = uVar7;
  do {
    if ((long)end._M_current - (long)begin._M_current <= (long)uVar7) {
      return (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )end._M_current;
    }
    pcVar1 = _Var3._M_current + uVar6;
    pcVar9 = this->last_;
    pcVar2 = (tr->super_cpp_regex_traits<char>).ctype_;
    cVar4 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)_Var3._M_current[uVar6]);
    bVar10 = cVar4 == *pcVar9;
    pcVar8 = pcVar1;
    if (bVar10) {
      if (pcVar9 != this->begin_) {
        pcVar8 = _Var3._M_current + uVar6;
        do {
          pcVar8 = pcVar8 + -1;
          pcVar2 = (tr->super_cpp_regex_traits<char>).ctype_;
          cVar4 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)*pcVar8);
          bVar10 = cVar4 == pcVar9[-1];
          if (!bVar10) goto LAB_0013d40d;
          pcVar9 = pcVar9 + -1;
        } while (pcVar9 != this->begin_);
      }
    }
    else {
LAB_0013d40d:
      pcVar2 = (tr->super_cpp_regex_traits<char>).ctype_;
      bVar5 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)*pcVar1);
      uVar6 = (ulong)this->offsets_[bVar5];
    }
    if (bVar10) {
      return (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )pcVar8;
    }
    uVar7 = uVar7 + uVar6;
    _Var3._M_current = pcVar1;
  } while( true );
}

Assistant:

BidiIter find_nocase_(BidiIter begin, BidiIter end, Traits const &tr) const
    {
        typedef typename boost::iterator_difference<BidiIter>::type diff_type;
        diff_type const endpos = std::distance(begin, end);
        diff_type offset = static_cast<diff_type>(this->length_);

        for(diff_type curpos = offset; curpos < endpos; curpos += offset)
        {
            std::advance(begin, offset);

            char_type const *pat_tmp = this->last_;
            BidiIter str_tmp = begin;

            for(; tr.translate_nocase(*str_tmp) == *pat_tmp; --pat_tmp, --str_tmp)
            {
                if(pat_tmp == this->begin_)
                {
                    return str_tmp;
                }
            }

            offset = this->offsets_[tr.hash(tr.translate_nocase(*begin))];
        }

        return end;
    }